

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContentNormalizer.cc
# Opt level: O2

void __thiscall ContentNormalizer::handleToken(ContentNormalizer *this,Token *token)

{
  token_type_e tVar1;
  ulong uVar2;
  long lVar3;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  char cVar4;
  ulong uVar5;
  string *psVar6;
  string local_60;
  allocator<char> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  tVar1 = token->type;
  if (tVar1 == tt_eof) {
LAB_0011ed19:
    QPDFObjectHandle::TokenFilter::writeToken(&this->super_TokenFilter,token);
    return;
  }
  if (tVar1 == tt_bad) {
    this->any_bad_tokens = true;
    this->last_token_was_bad = true;
    goto LAB_0011ed19;
  }
  this->last_token_was_bad = false;
  if (tVar1 == tt_name) {
    ::qpdf::Name::normalize(&local_60,&token->value);
    QPDFObjectHandle::TokenFilter::write(&this->super_TokenFilter,(int)&local_60,__buf_01,in_RCX);
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    if (tVar1 != tt_string) {
      if (tVar1 != tt_space) goto LAB_0011ed19;
      uVar2 = (token->raw_value)._M_string_length;
      psVar6 = &token->raw_value;
      uVar5 = 0;
      lVar3 = std::__cxx11::string::find((char)psVar6,0xd);
      while( true ) {
        if (lVar3 == -1) {
          if (uVar2 < uVar5 || (void *)(uVar2 - uVar5) == (void *)0x0) {
            return;
          }
          QPDFObjectHandle::TokenFilter::write
                    (&this->super_TokenFilter,(int)uVar5 + (int)(psVar6->_M_dataplus)._M_p,
                     (void *)(uVar2 - uVar5),in_RCX);
          return;
        }
        if ((void *)(lVar3 - uVar5) != (void *)0x0) {
          QPDFObjectHandle::TokenFilter::write
                    (&this->super_TokenFilter,(int)uVar5 + (int)(psVar6->_M_dataplus)._M_p,
                     (void *)(lVar3 - uVar5),in_RCX);
        }
        uVar5 = lVar3 + 1;
        if (uVar2 <= uVar5) break;
        if ((psVar6->_M_dataplus)._M_p[uVar5] != '\n') {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"\n",local_40);
          QPDFObjectHandle::TokenFilter::write(&this->super_TokenFilter,(int)&local_60,__buf,in_RCX)
          ;
          std::__cxx11::string::~string((string *)&local_60);
        }
        lVar3 = std::__cxx11::string::find((char)psVar6,0xd);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"\n",local_40);
      QPDFObjectHandle::TokenFilter::write(&this->super_TokenFilter,(int)&local_60,__buf_03,in_RCX);
      goto LAB_0011eed1;
    }
    QPDFObjectHandle::newString((string *)local_40);
    QPDFObjectHandle::unparse_abi_cxx11_(&local_60,(QPDFObjectHandle *)local_40);
    QPDFObjectHandle::TokenFilter::write(&this->super_TokenFilter,(int)&local_60,__buf_00,in_RCX);
    std::__cxx11::string::~string((string *)&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  }
  cVar4 = (char)token + '(';
  lVar3 = std::__cxx11::string::find(cVar4,0xd);
  if ((lVar3 == -1) && (lVar3 = std::__cxx11::string::find(cVar4,10), lVar3 == -1)) {
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"\n",local_40);
  QPDFObjectHandle::TokenFilter::write(&this->super_TokenFilter,(int)&local_60,__buf_02,in_RCX);
LAB_0011eed1:
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void
ContentNormalizer::handleToken(QPDFTokenizer::Token const& token)
{
    QPDFTokenizer::token_type_e token_type = token.getType();

    if (token_type == QPDFTokenizer::tt_bad) {
        this->any_bad_tokens = true;
        this->last_token_was_bad = true;
    } else if (token_type != QPDFTokenizer::tt_eof) {
        this->last_token_was_bad = false;
    }

    switch (token_type) {
    case QPDFTokenizer::tt_space:
        {
            std::string const& value = token.getRawValue();
            auto size = value.size();
            size_t pos = 0;
            auto r_pos = value.find('\r');
            while (r_pos != std::string::npos) {
                if (pos != r_pos) {
                    write(&value[pos], r_pos - pos);
                }
                if (++r_pos >= size) {
                    write("\n");
                    return;
                }
                if (value[r_pos] != '\n') {
                    write("\n");
                }
                pos = r_pos;
                r_pos = value.find('\r', pos);
            }
            if (pos < size) {
                write(&value[pos], size - pos);
            }
        }
        return;

    case QPDFTokenizer::tt_string:
        // Replacing string and name tokens in this way normalizes their representation as this will
        // automatically handle quoting of unprintable characters, etc.
        write(QPDFObjectHandle::newString(token.getValue()).unparse());
        break;

    case QPDFTokenizer::tt_name:
        write(Name::normalize(token.getValue()));
        break;

    default:
        writeToken(token);
        return;
    }

    // tt_string or tt_name
    std::string const& value = token.getRawValue();
    if (value.find('\r') != std::string::npos || value.find('\n') != std::string::npos) {
        write("\n");
    }
}